

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

void __thiscall Tracker::start(Tracker *this)

{
  long lVar1;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
  ::clear(&(this->m_data)._M_t);
  lVar1 = std::chrono::_V2::system_clock::now();
  this->m_trackerStart = (double)(lVar1 / 1000) * 0.001;
  this->m_running = true;
  return;
}

Assistant:

void Tracker::start() {
    m_data.clear();

    auto start = std::chrono::high_resolution_clock::now();
    m_trackerStart = std::chrono::time_point_cast<std::chrono::microseconds>(start).time_since_epoch().count() * 0.001;
    m_running = true;
}